

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGRSubgraphMining.cpp
# Opt level: O1

void dgrminer::find_isolated_nodes_and_addition_edges
               (AdjacencyListCrate *adjacency_list,
               vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
               *antecedent_pattern_edges_ADDED,
               vector<int,_std::allocator<int>_> *antecedent_pattern_node_id_ADDED,
               vector<int,_std::allocator<int>_> *antecedent_pattern_node_labels_ADDED,
               vector<int,_std::allocator<int>_> *antecedent_pattern_isolated_node_id,
               vector<int,_std::allocator<int>_> *antecedent_pattern_isolated_node_labels,
               vector<int,_std::allocator<int>_> *antecedent_pattern_isolated_node_changetime,
               PartialUnion pu,bool search_for_anomalies,
               set<int,_std::less<int>,_std::allocator<int>_> *nodes_occupied_by_antecedent,
               set<int,_std::less<int>,_std::allocator<int>_> *edges_occupied_by_antecedent,
               set<int,_std::less<int>,_std::allocator<int>_> *occupied_node_ids_in_adj_list,
               int g_id,vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                        *anomaly_pattern_edges,
               set<dgrminer::anomaly_pattern_with_occurrences,_std::less<dgrminer::anomaly_pattern_with_occurrences>,_std::allocator<dgrminer::anomaly_pattern_with_occurrences>_>
               *anomaly_patterns,bool debug)

{
  int *piVar1;
  int *piVar2;
  mapped_type mVar3;
  byte bVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int iVar8;
  int iVar9;
  _Base_ptr p_Var10;
  pointer piVar11;
  mapped_type *pmVar12;
  _Rb_tree_node_base *p_Var13;
  pointer paVar14;
  iterator iVar15;
  ulong uVar16;
  int *piVar17;
  int *piVar18;
  array<int,_10UL> *paVar19;
  _Rb_tree_header *p_Var20;
  long lVar21;
  int *piVar22;
  ulong uVar23;
  long lVar24;
  _Rb_tree_header *p_Var25;
  _Base_ptr p_Var26;
  _Base_ptr p_Var27;
  _Base_ptr p_Var28;
  ulong uVar29;
  _Rb_tree_header *p_Var30;
  ulong uVar31;
  _Self __tmp;
  uint uVar32;
  pointer paVar33;
  bool bVar34;
  bool bVar35;
  int local_294;
  ulong local_290;
  vector<int,_std::allocator<int>_> which_indices_were_used;
  vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> anomaly_pattern_edges_all;
  array<int,_10UL> anomaly_edge;
  set<dgrminer::non_dummy_vertices_and_edges,_std::less<dgrminer::non_dummy_vertices_and_edges>,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
  sets_of_used_edges;
  vector<int,_std::allocator<int>_> selected_ids_from_adj;
  vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> adj_list_nodes;
  vector<bool,_std::allocator<bool>_> adjacency_nodes_are_used;
  map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
  from_pattern_id_to_adj_id_map;
  vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
  maximal_patterns_of_addition_edges;
  vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> local_d8;
  vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
  vector_of_edge_sets;
  vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> local_78;
  vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> local_60;
  vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
  local_48;
  
  std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::vector
            (&adj_list_nodes,&adjacency_list->nodes);
  selected_ids_from_adj.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  selected_ids_from_adj.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  selected_ids_from_adj.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  which_indices_were_used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  which_indices_were_used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  which_indices_were_used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  anomaly_edge._M_elems._0_8_ = anomaly_edge._M_elems._0_8_ & 0xffffffffffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&adjacency_nodes_are_used,
             ((long)adj_list_nodes.
                    super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)adj_list_nodes.
                    super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555,
             (bool *)&anomaly_edge,(allocator_type *)&from_pattern_id_to_adj_id_map);
  anomaly_edge._M_elems._0_8_ = anomaly_edge._M_elems._0_8_ & 0xffffffff00000000;
  if (which_indices_were_used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      which_indices_were_used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&which_indices_were_used,
               (iterator)
               which_indices_were_used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,anomaly_edge._M_elems);
  }
  else {
    *which_indices_were_used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
     super__Vector_impl_data._M_finish = 0;
    which_indices_were_used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         which_indices_were_used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  p_Var10 = (_Base_ptr)(pu.labelEncoding._M_t._M_impl._0_8_ + 8);
  piVar1 = (pu.edges.
            super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl
            .super__Vector_impl_data._M_start)->_M_elems + 2;
  piVar2 = (pu.nodes.
            super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>._M_impl
            .super__Vector_impl_data._M_finish)->_M_elems + 2;
  local_294 = 0;
  do {
    paVar33 = pu.edges.
              super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
    p_Var30 = &sets_of_used_edges._M_t._M_impl.super__Rb_tree_header;
    if ((ulong)((long)(antecedent_pattern_isolated_node_id->
                      super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
                      ._M_finish -
                (long)(antecedent_pattern_isolated_node_id->
                      super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
                      ._M_start >> 2) <= (ulong)(long)local_294) {
      if ((antecedent_pattern_edges_ADDED->
          super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
          _M_impl.super__Vector_impl_data._M_finish ==
          (antecedent_pattern_edges_ADDED->
          super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
          _M_impl.super__Vector_impl_data._M_start) {
        from_pattern_id_to_adj_id_map._M_t._M_impl._0_8_ = 0;
        from_pattern_id_to_adj_id_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red
        ;
        from_pattern_id_to_adj_id_map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        from_pattern_id_to_adj_id_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        lVar21 = *(long *)(pu.edges.
                           super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_elems;
        if (*(long *)((pu.edges.
                       super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_elems + 2) != lVar21)
        {
          lVar24 = 0;
          uVar23 = 0;
          do {
            paVar19 = (array<int,_10UL> *)(lVar21 + lVar24);
            if ((_Base_ptr)
                from_pattern_id_to_adj_id_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ ==
                from_pattern_id_to_adj_id_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
               ) {
              std::vector<std::array<int,10ul>,std::allocator<std::array<int,10ul>>>::
              _M_realloc_insert<std::array<int,10ul>const&>
                        ((vector<std::array<int,10ul>,std::allocator<std::array<int,10ul>>> *)
                         &from_pattern_id_to_adj_id_map,
                         (iterator)
                         from_pattern_id_to_adj_id_map._M_t._M_impl.super__Rb_tree_header._M_header.
                         _0_8_,paVar19);
            }
            else {
              *(undefined8 *)
               (from_pattern_id_to_adj_id_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ +
               0x20) = *(undefined8 *)(paVar19->_M_elems + 8);
              uVar5 = *(undefined8 *)paVar19->_M_elems;
              uVar6 = *(undefined8 *)(paVar19->_M_elems + 2);
              uVar7 = *(undefined8 *)(paVar19->_M_elems + 6);
              *(undefined8 *)
               (from_pattern_id_to_adj_id_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ +
               0x10) = *(undefined8 *)(paVar19->_M_elems + 4);
              *(undefined8 *)
               (from_pattern_id_to_adj_id_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ +
               0x18) = uVar7;
              *(undefined8 *)
               from_pattern_id_to_adj_id_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                   uVar5;
              *(undefined8 *)
               (from_pattern_id_to_adj_id_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 8
               ) = uVar6;
              from_pattern_id_to_adj_id_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                   from_pattern_id_to_adj_id_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_
                   + 0x28;
            }
            uVar23 = uVar23 + 1;
            lVar21 = *(long *)paVar33->_M_elems;
            lVar24 = lVar24 + 0x28;
          } while (uVar23 < (ulong)((*(long *)(paVar33->_M_elems + 2) - lVar21 >> 3) *
                                   -0x3333333333333333));
        }
        anomaly_edge._M_elems[0] = 0;
        anomaly_edge._M_elems[1] = 0;
        anomaly_edge._M_elems[2] = 0;
        anomaly_edge._M_elems[3] = 0;
        anomaly_edge._M_elems[4] = 0;
        anomaly_edge._M_elems[5] = 0;
        anomaly_edge._M_elems[8] = 0;
        std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::operator=
                  ((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
                   &anomaly_edge,
                   (vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
                   &from_pattern_id_to_adj_id_map);
        std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::vector
                  (&local_60,
                   (vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
                   &from_pattern_id_to_adj_id_map);
        compute_min_code((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
                         &sets_of_used_edges,&local_60);
        uVar5 = sets_of_used_edges._M_t._M_impl._0_8_;
        sets_of_used_edges._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        sets_of_used_edges._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        sets_of_used_edges._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        sets_of_used_edges._M_t._M_impl._0_8_ = 0;
        if (local_60.
            super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_60.
                          super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        iVar15 = std::
                 _Rb_tree<dgrminer::anomaly_pattern_with_occurrences,_dgrminer::anomaly_pattern_with_occurrences,_std::_Identity<dgrminer::anomaly_pattern_with_occurrences>,_std::less<dgrminer::anomaly_pattern_with_occurrences>,_std::allocator<dgrminer::anomaly_pattern_with_occurrences>_>
                 ::find((_Rb_tree<dgrminer::anomaly_pattern_with_occurrences,_dgrminer::anomaly_pattern_with_occurrences,_std::_Identity<dgrminer::anomaly_pattern_with_occurrences>,_std::less<dgrminer::anomaly_pattern_with_occurrences>,_std::allocator<dgrminer::anomaly_pattern_with_occurrences>_>
                         *)pu.labelEncoding._M_t._M_impl._0_8_,(key_type *)&anomaly_edge);
        if (iVar15._M_node == p_Var10) {
          std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     (anomaly_edge._M_elems + 6),
                     (int *)&pu.edges.
                             super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
          std::
          _Rb_tree<dgrminer::anomaly_pattern_with_occurrences,dgrminer::anomaly_pattern_with_occurrences,std::_Identity<dgrminer::anomaly_pattern_with_occurrences>,std::less<dgrminer::anomaly_pattern_with_occurrences>,std::allocator<dgrminer::anomaly_pattern_with_occurrences>>
          ::_M_insert_unique<dgrminer::anomaly_pattern_with_occurrences_const&>
                    ((_Rb_tree<dgrminer::anomaly_pattern_with_occurrences,dgrminer::anomaly_pattern_with_occurrences,std::_Identity<dgrminer::anomaly_pattern_with_occurrences>,std::less<dgrminer::anomaly_pattern_with_occurrences>,std::allocator<dgrminer::anomaly_pattern_with_occurrences>>
                      *)pu.labelEncoding._M_t._M_impl._0_8_,
                     (anomaly_pattern_with_occurrences *)&anomaly_edge);
        }
        else {
          std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     &iVar15._M_node[1]._M_right,
                     (int *)&pu.edges.
                             super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
        }
        if (uVar5 != 0) {
          operator_delete((void *)uVar5);
        }
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        ~_Rb_tree((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                  (anomaly_edge._M_elems + 6));
        if (anomaly_edge._M_elems._0_8_ != 0) {
          operator_delete((void *)anomaly_edge._M_elems._0_8_);
        }
        if (from_pattern_id_to_adj_id_map._M_t._M_impl._0_8_ != 0) {
          operator_delete((void *)from_pattern_id_to_adj_id_map._M_t._M_impl._0_8_);
        }
      }
      else {
        from_pattern_id_to_adj_id_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             from_pattern_id_to_adj_id_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
             0xffffffff00000000;
        from_pattern_id_to_adj_id_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        from_pattern_id_to_adj_id_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &from_pattern_id_to_adj_id_map._M_t._M_impl.super__Rb_tree_header._M_header;
        from_pattern_id_to_adj_id_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        piVar11 = (antecedent_pattern_isolated_node_id->
                  super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                  _M_start;
        from_pattern_id_to_adj_id_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             from_pattern_id_to_adj_id_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        if ((antecedent_pattern_isolated_node_id->super__Vector_base<int,_std::allocator<int>_>).
            _M_impl.super__Vector_impl_data._M_finish != piVar11) {
          uVar23 = 0;
          do {
            mVar3 = selected_ids_from_adj.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar23];
            anomaly_edge._M_elems[0]._0_1_ = (char)piVar11[uVar23];
            pmVar12 = std::
                      map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                      ::operator[](&from_pattern_id_to_adj_id_map,(key_type_conflict *)&anomaly_edge
                                  );
            *pmVar12 = mVar3;
            uVar23 = uVar23 + 1;
            piVar11 = (antecedent_pattern_isolated_node_id->
                      super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
                      ._M_start;
          } while (uVar23 < (ulong)((long)(antecedent_pattern_isolated_node_id->
                                          super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                          super__Vector_impl_data._M_finish - (long)piVar11 >> 2));
        }
        sets_of_used_edges._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             sets_of_used_edges._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
             0xffffffff00000000;
        sets_of_used_edges._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        sets_of_used_edges._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        sets_of_used_edges._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &p_Var30->_M_header;
        sets_of_used_edges._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             &p_Var30->_M_header;
        find_addition_nodes_and_edges
                  (adjacency_list,antecedent_pattern_edges_ADDED,antecedent_pattern_node_id_ADDED,
                   antecedent_pattern_node_labels_ADDED,&from_pattern_id_to_adj_id_map,
                   &adj_list_nodes,&sets_of_used_edges,
                   (set<int,_std::less<int>,_std::allocator<int>_> *)
                   pu.nodes.
                   super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish,
                   (set<int,_std::less<int>,_std::allocator<int>_> *)
                   pu.nodes.
                   super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage,
                   (bool)(undefined1)
                         pu.labelEncoding._M_t._M_impl.super__Rb_tree_header._M_header._M_color);
        vector_of_edge_sets.
        super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        vector_of_edge_sets.
        super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        vector_of_edge_sets.
        super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        for (p_Var13 = sets_of_used_edges._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var13 != p_Var30;
            p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13)) {
          std::
          vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
          ::push_back(&vector_of_edge_sets,(value_type *)(p_Var13 + 1));
        }
        std::
        vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
        ::vector(&local_48,&vector_of_edge_sets);
        find_maximal_subsets_of_ndve(&maximal_patterns_of_addition_edges,&local_48);
        std::
        vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
        ::~vector(&local_48);
        if (maximal_patterns_of_addition_edges.
            super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            maximal_patterns_of_addition_edges.
            super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          local_290 = 0;
          do {
            anomaly_pattern_edges_all.
            super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            anomaly_pattern_edges_all.
            super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            anomaly_pattern_edges_all.
            super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            lVar21 = *(long *)paVar33->_M_elems;
            if (*(long *)(paVar33->_M_elems + 2) != lVar21) {
              lVar24 = 0;
              uVar23 = 0;
              do {
                paVar19 = (array<int,_10UL> *)(lVar21 + lVar24);
                if (anomaly_pattern_edges_all.
                    super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish ==
                    anomaly_pattern_edges_all.
                    super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<std::array<int,10ul>,std::allocator<std::array<int,10ul>>>::
                  _M_realloc_insert<std::array<int,10ul>const&>
                            ((vector<std::array<int,10ul>,std::allocator<std::array<int,10ul>>> *)
                             &anomaly_pattern_edges_all,
                             (iterator)
                             anomaly_pattern_edges_all.
                             super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish,paVar19);
                }
                else {
                  *(undefined8 *)
                   ((anomaly_pattern_edges_all.
                     super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish)->_M_elems + 8) =
                       *(undefined8 *)(paVar19->_M_elems + 8);
                  uVar5 = *(undefined8 *)paVar19->_M_elems;
                  uVar6 = *(undefined8 *)(paVar19->_M_elems + 2);
                  uVar7 = *(undefined8 *)(paVar19->_M_elems + 6);
                  *(undefined8 *)
                   ((anomaly_pattern_edges_all.
                     super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish)->_M_elems + 4) =
                       *(undefined8 *)(paVar19->_M_elems + 4);
                  *(undefined8 *)
                   ((anomaly_pattern_edges_all.
                     super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish)->_M_elems + 6) = uVar7;
                  *(undefined8 *)
                   (anomaly_pattern_edges_all.
                    super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish)->_M_elems = uVar5;
                  *(undefined8 *)
                   ((anomaly_pattern_edges_all.
                     super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish)->_M_elems + 2) = uVar6;
                  anomaly_pattern_edges_all.
                  super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish =
                       anomaly_pattern_edges_all.
                       super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish + 1;
                }
                uVar23 = uVar23 + 1;
                lVar21 = *(long *)paVar33->_M_elems;
                lVar24 = lVar24 + 0x28;
              } while (uVar23 < (ulong)((*(long *)(paVar33->_M_elems + 2) - lVar21 >> 3) *
                                       -0x3333333333333333));
            }
            paVar14 = (antecedent_pattern_edges_ADDED->
                      super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            if ((antecedent_pattern_edges_ADDED->
                super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
                _M_impl.super__Vector_impl_data._M_finish == paVar14) {
              uVar16 = 0;
              uVar23 = 0;
            }
            else {
              lVar21 = 0;
              uVar32 = 0;
              uVar23 = 0;
              do {
                lVar24 = 0;
                do {
                  anomaly_edge._M_elems[lVar24] =
                       *(int *)((long)paVar14->_M_elems + lVar24 * 4 + lVar21);
                  lVar24 = lVar24 + 1;
                } while (lVar24 != 10);
                paVar14 = paVar14 + uVar23;
                p_Var30 = &maximal_patterns_of_addition_edges.
                           super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
                           ._M_impl.super__Vector_impl_data._M_start[local_290].non_dummy_vertices.
                           _M_t._M_impl.super__Rb_tree_header;
                p_Var27 = maximal_patterns_of_addition_edges.
                          super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
                          ._M_impl.super__Vector_impl_data._M_start[local_290].non_dummy_vertices.
                          _M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
                p_Var28 = &p_Var30->_M_header;
                if (p_Var27 != (_Base_ptr)0x0) {
                  p_Var26 = p_Var27;
                  do {
                    if (paVar14->_M_elems[0] <= (int)*(size_t *)(p_Var26 + 1)) {
                      p_Var28 = p_Var26;
                    }
                    p_Var26 = (&p_Var26->_M_left)
                              [(int)*(size_t *)(p_Var26 + 1) < paVar14->_M_elems[0]];
                  } while (p_Var26 != (_Base_ptr)0x0);
                }
                p_Var20 = p_Var30;
                if (((_Rb_tree_header *)p_Var28 != p_Var30) &&
                   (p_Var20 = (_Rb_tree_header *)p_Var28,
                   paVar14->_M_elems[0] < (int)((_Rb_tree_header *)p_Var28)->_M_node_count)) {
                  p_Var20 = p_Var30;
                }
                p_Var28 = &p_Var30->_M_header;
                if (p_Var27 != (_Base_ptr)0x0) {
                  do {
                    if (paVar14->_M_elems[1] <= (int)p_Var27[1]._M_color) {
                      p_Var28 = p_Var27;
                    }
                    p_Var27 = (&p_Var27->_M_left)[(int)p_Var27[1]._M_color < paVar14->_M_elems[1]];
                  } while (p_Var27 != (_Base_ptr)0x0);
                }
                p_Var27 = &p_Var30->_M_header;
                if (((_Rb_tree_header *)p_Var28 != p_Var30) &&
                   (p_Var27 = p_Var28, paVar14->_M_elems[1] < (int)p_Var28[1]._M_color)) {
                  p_Var27 = &p_Var30->_M_header;
                }
                p_Var28 = maximal_patterns_of_addition_edges.
                          super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
                          ._M_impl.super__Vector_impl_data._M_start[local_290].non_dummy_edges._M_t.
                          _M_impl.super__Rb_tree_header._M_header._M_parent;
                p_Var25 = &maximal_patterns_of_addition_edges.
                           super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
                           ._M_impl.super__Vector_impl_data._M_start[local_290].non_dummy_edges._M_t
                           ._M_impl.super__Rb_tree_header;
                p_Var26 = &p_Var25->_M_header;
                if (p_Var28 != (_Base_ptr)0x0) {
                  do {
                    if (paVar14->_M_elems[9] <= (int)p_Var28[1]._M_color) {
                      p_Var26 = p_Var28;
                    }
                    p_Var28 = (&p_Var28->_M_left)[(int)p_Var28[1]._M_color < paVar14->_M_elems[9]];
                  } while (p_Var28 != (_Base_ptr)0x0);
                }
                p_Var28 = &p_Var25->_M_header;
                if (((_Rb_tree_header *)p_Var26 != p_Var25) &&
                   (p_Var28 = p_Var26, paVar14->_M_elems[9] < (int)p_Var26[1]._M_color)) {
                  p_Var28 = &p_Var25->_M_header;
                }
                bVar35 = true;
                bVar34 = true;
                if (p_Var20 == p_Var30) {
                  bVar34 = paVar14->_M_elems[3] != 0;
                }
                if ((_Rb_tree_header *)p_Var27 == p_Var30) {
                  bVar35 = paVar14->_M_elems[8] != 0;
                }
                if (bVar34 == false) {
                  iVar8 = PartialUnion::getDummyLabel
                                    ((PartialUnion *)pu._0_8_,anomaly_edge._M_elems[2]);
                  anomaly_edge._M_elems[2] = iVar8;
                }
                if (bVar35 == false) {
                  anomaly_edge._M_elems[7] =
                       PartialUnion::getDummyLabel
                                 ((PartialUnion *)pu._0_8_,anomaly_edge._M_elems[7]);
                }
                if ((_Rb_tree_header *)p_Var28 == p_Var25) {
                  iVar8 = PartialUnion::getDummyLabel
                                    ((PartialUnion *)pu._0_8_,anomaly_edge._M_elems[5]);
                  anomaly_edge._M_elems[5] = iVar8;
                }
                if (anomaly_pattern_edges_all.
                    super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish ==
                    anomaly_pattern_edges_all.
                    super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<std::array<int,10ul>,std::allocator<std::array<int,10ul>>>::
                  _M_realloc_insert<std::array<int,10ul>const&>
                            ((vector<std::array<int,10ul>,std::allocator<std::array<int,10ul>>> *)
                             &anomaly_pattern_edges_all,
                             (iterator)
                             anomaly_pattern_edges_all.
                             super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish,&anomaly_edge);
                }
                else {
                  *(ulong *)((anomaly_pattern_edges_all.
                              super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish)->_M_elems + 8) =
                       CONCAT44(anomaly_edge._M_elems[9],anomaly_edge._M_elems[8]);
                  *(undefined8 *)
                   ((anomaly_pattern_edges_all.
                     super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish)->_M_elems + 4) =
                       anomaly_edge._M_elems._16_8_;
                  *(ulong *)((anomaly_pattern_edges_all.
                              super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish)->_M_elems + 6) =
                       CONCAT44(anomaly_edge._M_elems[7],anomaly_edge._M_elems[6]);
                  *(undefined8 *)
                   (anomaly_pattern_edges_all.
                    super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish)->_M_elems =
                       anomaly_edge._M_elems._0_8_;
                  *(undefined8 *)
                   ((anomaly_pattern_edges_all.
                     super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish)->_M_elems + 2) =
                       anomaly_edge._M_elems._8_8_;
                  anomaly_pattern_edges_all.
                  super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish =
                       anomaly_pattern_edges_all.
                       super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish + 1;
                }
                uVar32 = uVar32 + ((_Rb_tree_header *)p_Var28 == p_Var25) +
                         (uint)(bVar35 ^ 1) + (uint)(bVar34 ^ 1);
                uVar23 = uVar23 + 1;
                paVar14 = (antecedent_pattern_edges_ADDED->
                          super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                          )._M_impl.super__Vector_impl_data._M_start;
                uVar16 = ((long)(antecedent_pattern_edges_ADDED->
                                super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)paVar14 >> 3) *
                         -0x3333333333333333;
                lVar21 = lVar21 + 0x28;
              } while (uVar23 < uVar16);
              uVar23 = (ulong)uVar32;
              paVar33 = pu.edges.
                        super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
            }
            if (((*(long *)(paVar33->_M_elems + 2) != *(long *)paVar33->_M_elems) ||
                (uVar16 * 3 != uVar23)) ||
               (*(long *)(pu.nodes.
                          super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish[1]._M_elems + 4) == 0)) {
              anomaly_edge._M_elems[0] = 0;
              anomaly_edge._M_elems[1] = 0;
              anomaly_edge._M_elems[2] = 0;
              anomaly_edge._M_elems[3] = 0;
              anomaly_edge._M_elems[4] = 0;
              anomaly_edge._M_elems[5] = 0;
              anomaly_edge._M_elems[8] = 0;
              std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::operator=
                        ((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
                         &anomaly_edge,&anomaly_pattern_edges_all);
              std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::vector
                        (&local_78,&anomaly_pattern_edges_all);
              compute_min_code(&local_d8,&local_78);
              paVar14 = local_d8.
                        super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              local_d8.
              super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_d8.
              super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_d8.
              super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              if (local_78.
                  super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_78.
                                super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
              }
              iVar15 = std::
                       _Rb_tree<dgrminer::anomaly_pattern_with_occurrences,_dgrminer::anomaly_pattern_with_occurrences,_std::_Identity<dgrminer::anomaly_pattern_with_occurrences>,_std::less<dgrminer::anomaly_pattern_with_occurrences>,_std::allocator<dgrminer::anomaly_pattern_with_occurrences>_>
                       ::find((_Rb_tree<dgrminer::anomaly_pattern_with_occurrences,_dgrminer::anomaly_pattern_with_occurrences,_std::_Identity<dgrminer::anomaly_pattern_with_occurrences>,_std::less<dgrminer::anomaly_pattern_with_occurrences>,_std::allocator<dgrminer::anomaly_pattern_with_occurrences>_>
                               *)pu.labelEncoding._M_t._M_impl._0_8_,(key_type *)&anomaly_edge);
              if (iVar15._M_node == p_Var10) {
                std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
                _M_insert_unique<int_const&>
                          ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                            *)(anomaly_edge._M_elems + 6),
                           (int *)&pu.edges.
                                   super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish);
                std::
                _Rb_tree<dgrminer::anomaly_pattern_with_occurrences,dgrminer::anomaly_pattern_with_occurrences,std::_Identity<dgrminer::anomaly_pattern_with_occurrences>,std::less<dgrminer::anomaly_pattern_with_occurrences>,std::allocator<dgrminer::anomaly_pattern_with_occurrences>>
                ::_M_insert_unique<dgrminer::anomaly_pattern_with_occurrences_const&>
                          ((_Rb_tree<dgrminer::anomaly_pattern_with_occurrences,dgrminer::anomaly_pattern_with_occurrences,std::_Identity<dgrminer::anomaly_pattern_with_occurrences>,std::less<dgrminer::anomaly_pattern_with_occurrences>,std::allocator<dgrminer::anomaly_pattern_with_occurrences>>
                            *)pu.labelEncoding._M_t._M_impl._0_8_,
                           (anomaly_pattern_with_occurrences *)&anomaly_edge);
              }
              else {
                std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
                _M_insert_unique<int_const&>
                          ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                            *)&iVar15._M_node[1]._M_right,
                           (int *)&pu.edges.
                                   super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish);
              }
              if (paVar14 != (pointer)0x0) {
                operator_delete(paVar14);
              }
              std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
              ~_Rb_tree((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                         *)(anomaly_edge._M_elems + 6));
              if (anomaly_edge._M_elems._0_8_ != 0) {
                operator_delete((void *)anomaly_edge._M_elems._0_8_);
              }
            }
            if (anomaly_pattern_edges_all.
                super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(anomaly_pattern_edges_all.
                              super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
            }
            local_290 = local_290 + 1;
          } while (local_290 <
                   (ulong)(((long)maximal_patterns_of_addition_edges.
                                  super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)maximal_patterns_of_addition_edges.
                                  super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 5) *
                          -0x5555555555555555));
        }
        std::
        vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
        ::~vector(&maximal_patterns_of_addition_edges);
        std::
        vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
        ::~vector(&vector_of_edge_sets);
        std::
        _Rb_tree<dgrminer::non_dummy_vertices_and_edges,_dgrminer::non_dummy_vertices_and_edges,_std::_Identity<dgrminer::non_dummy_vertices_and_edges>,_std::less<dgrminer::non_dummy_vertices_and_edges>,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
        ::~_Rb_tree(&sets_of_used_edges._M_t);
        std::
        _Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
        ::~_Rb_tree(&from_pattern_id_to_adj_id_map._M_t);
      }
      if ((antecedent_pattern_isolated_node_id->super__Vector_base<int,_std::allocator<int>_>).
          _M_impl.super__Vector_impl_data._M_finish ==
          (antecedent_pattern_isolated_node_id->super__Vector_base<int,_std::allocator<int>_>).
          _M_impl.super__Vector_impl_data._M_start) break;
    }
    uVar16 = (ulong)which_indices_were_used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[local_294];
    uVar23 = ((long)adj_list_nodes.
                    super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)adj_list_nodes.
                    super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
    if (uVar23 < uVar16 || uVar23 - uVar16 == 0) {
      bVar34 = false;
    }
    else {
      bVar4 = 1;
      do {
        piVar17 = piVar1;
        for (piVar22 = *(int **)((pu.edges.
                                  super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_M_elems + 4);
            piVar22 != (int *)0x0;
            piVar22 = *(int **)(piVar22 + (ulong)((long)piVar22[8] < (long)uVar16) * 2 + 4)) {
          if ((long)uVar16 <= (long)piVar22[8]) {
            piVar17 = piVar22;
          }
        }
        piVar22 = piVar1;
        if ((piVar17 != piVar1) && (piVar22 = piVar17, (long)uVar16 < (long)piVar17[8])) {
          piVar22 = piVar1;
        }
        piVar18 = piVar2;
        for (piVar17 = *(int **)((pu.nodes.
                                  super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish)->_M_elems + 4);
            piVar17 != (int *)0x0;
            piVar17 = *(int **)(piVar17 + (ulong)((long)piVar17[8] < (long)uVar16) * 2 + 4)) {
          if ((long)uVar16 <= (long)piVar17[8]) {
            piVar18 = piVar17;
          }
        }
        piVar17 = piVar2;
        if ((piVar18 != piVar2) && (piVar17 = piVar18, (long)uVar16 < (long)piVar18[8])) {
          piVar17 = piVar2;
        }
        uVar23 = uVar16 + 0x3f;
        if (-1 < (long)uVar16) {
          uVar23 = uVar16;
        }
        uVar31 = 1L << ((byte)uVar16 & 0x3f);
        bVar34 = true;
        if (piVar22 == piVar1) {
          uVar29 = (ulong)((uVar16 & 0x800000000000003f) < 0x8000000000000001);
          if (((adjacency_nodes_are_used.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                [((long)uVar23 >> 6) + (uVar29 - 1)] & uVar31) == 0) && (piVar17 == piVar2)) {
            iVar8 = PartialUnion::getAntecedentLabel
                              ((PartialUnion *)pu._0_8_,
                               adj_list_nodes.
                               super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar16]._M_elems[2]);
            lVar21 = (long)local_294;
            iVar9 = PartialUnion::getAntecedentLabel
                              ((PartialUnion *)pu._0_8_,
                               (antecedent_pattern_isolated_node_labels->
                               super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start[lVar21]);
            if (iVar8 == iVar9) {
              iVar8 = PartialUnion::getAntecedentChangetime
                                ((PartialUnion *)pu._0_8_,
                                 adj_list_nodes.
                                 super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar16]._M_elems[1]);
              iVar9 = PartialUnion::getAntecedentChangetime
                                ((PartialUnion *)pu._0_8_,
                                 (antecedent_pattern_isolated_node_changetime->
                                 super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_start[lVar21]);
              bVar34 = iVar8 == iVar9;
            }
            else {
              bVar34 = false;
            }
            if (bVar34) {
              which_indices_were_used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar21] = (int)uVar16 + 1;
              anomaly_edge._M_elems._0_8_ = anomaly_edge._M_elems._0_8_ & 0xffffffff00000000;
              if (which_indices_were_used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  which_indices_were_used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          (&which_indices_were_used,
                           (iterator)
                           which_indices_were_used.super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_finish,anomaly_edge._M_elems);
              }
              else {
                *which_indices_were_used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish = 0;
                which_indices_were_used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     which_indices_were_used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              if (selected_ids_from_adj.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  selected_ids_from_adj.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)&selected_ids_from_adj,
                           (iterator)
                           selected_ids_from_adj.super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_finish,
                           adj_list_nodes.
                           super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar16]._M_elems);
              }
              else {
                *selected_ids_from_adj.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish =
                     adj_list_nodes.
                     super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar16]._M_elems[0];
                selected_ids_from_adj.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     selected_ids_from_adj.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              adjacency_nodes_are_used.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
              [((long)uVar23 >> 6) + (uVar29 - 1)] =
                   adjacency_nodes_are_used.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                   [((long)uVar23 >> 6) + (uVar29 - 1)] | uVar31;
              local_294 = local_294 + 1;
              bVar4 = 0;
            }
            bVar34 = (bool)(bVar34 ^ 1);
          }
        }
      } while ((bVar34) &&
              (uVar16 = uVar16 + 1,
              uVar23 = ((long)adj_list_nodes.
                              super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)adj_list_nodes.
                              super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555,
              uVar16 <= uVar23 && uVar23 - uVar16 != 0));
      bVar34 = (bool)(bVar4 ^ 1);
    }
    if ((local_294 != 0) && (!bVar34)) {
      uVar23 = (long)which_indices_were_used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish[-2] - 1;
      uVar16 = (long)which_indices_were_used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish[-2] + 0x3e;
      if (-1 < (long)uVar23) {
        uVar16 = uVar23;
      }
      bVar4 = (byte)uVar23 & 0x3f;
      adjacency_nodes_are_used.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
      [((long)uVar16 >> 6) + ((ulong)((uVar23 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
           adjacency_nodes_are_used.super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
           [((long)uVar16 >> 6) + ((ulong)((uVar23 & 0x800000000000003f) < 0x8000000000000001) - 1)]
           & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
      selected_ids_from_adj.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           selected_ids_from_adj.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + -1;
      local_294 = local_294 + -1;
      which_indices_were_used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           which_indices_were_used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + -1;
    }
  } while (local_294 != 0 || bVar34);
  if (adjacency_nodes_are_used.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(adjacency_nodes_are_used.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    adjacency_nodes_are_used.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    adjacency_nodes_are_used.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
    adjacency_nodes_are_used.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    adjacency_nodes_are_used.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
    adjacency_nodes_are_used.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  }
  if (which_indices_were_used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(which_indices_were_used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (selected_ids_from_adj.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(selected_ids_from_adj.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (adj_list_nodes.
      super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(adj_list_nodes.
                    super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void find_isolated_nodes_and_addition_edges(AdjacencyListCrate & adjacency_list, std::vector<std::array<int, PAT___SIZE>> & antecedent_pattern_edges_ADDED,
		std::vector<int> & antecedent_pattern_node_id_ADDED,
		std::vector<int> & antecedent_pattern_node_labels_ADDED,
		std::vector<int> & antecedent_pattern_isolated_node_id,
		std::vector<int> & antecedent_pattern_isolated_node_labels,
		std::vector<int> & antecedent_pattern_isolated_node_changetime, PartialUnion pu, bool search_for_anomalies,
		std::set<int> & nodes_occupied_by_antecedent, std::set<int> & edges_occupied_by_antecedent,
		std::set<int> & occupied_node_ids_in_adj_list,
		int g_id,
		std::vector<std::array<int, PAT___SIZE>> & anomaly_pattern_edges,
		std::set<anomaly_pattern_with_occurrences> & anomaly_patterns,
		bool debug)
	{
		std::vector<std::array<int, ADJ_NODES___SIZE>> adj_list_nodes = adjacency_list.nodes;
		std::vector<int> selected_ids_from_adj; // which IDS of adj nodes correspond to those in antecedent_pattern_isolated_node_id
		std::vector<int> which_indices_were_used; // here we save the currently used indices for backtracking
		std::vector<bool> adjacency_nodes_are_used(adj_list_nodes.size(), false); // here we save which nodes from the adjacency list are already used

		// DO DFS:

		int isolated_vertex_current_index = 0; // we want to process the the first isolated vertex
		which_indices_were_used.push_back(0); // for the first isolated node, we want to start from the first node of adjacency list

		while (true)
		{
			// if all isolated nodes were mapped (found):
			if (antecedent_pattern_isolated_node_id.size() <= isolated_vertex_current_index)
			{
				// and there are no addition edges (and thus also no addition nodes because of the connectedness of the pattern), just save the pattern:
				if (antecedent_pattern_edges_ADDED.size() == 0)
				{
					std::vector<std::array<int, PAT___SIZE>> anomaly_pattern_edges_all;
					for (size_t i = 0; i < anomaly_pattern_edges.size(); i++)
					{
						anomaly_pattern_edges_all.push_back(anomaly_pattern_edges[i]);
					}
					// save the anomalous pattern with its occurrences - only regular edges
					anomaly_pattern_with_occurrences ap;
					ap.anomalous_pattern_edges = anomaly_pattern_edges_all;
					ap.minimum_code = compute_min_code(anomaly_pattern_edges_all);
					auto it = anomaly_patterns.find(ap);
					if (it != std::end(anomaly_patterns))
					{

						(it->occurrences).insert(g_id);
					}
					else
					{
						ap.occurrences.insert(g_id);
						anomaly_patterns.insert(ap);
					}
				}
				// but if there are also some addition edges (possibly with addition nodes), try to find them:
				else
				{
					std::map<char, int> from_pattern_id_to_adj_id_map;
					for (size_t i = 0; i < antecedent_pattern_isolated_node_id.size(); i++)
					{
						from_pattern_id_to_adj_id_map[antecedent_pattern_isolated_node_id[i]] = selected_ids_from_adj[i];
					}

					// OUTPUT of find_addition_nodes_and_edges will be here:
					std::set<non_dummy_vertices_and_edges> sets_of_used_edges;
					find_addition_nodes_and_edges(adjacency_list, antecedent_pattern_edges_ADDED, antecedent_pattern_node_id_ADDED, antecedent_pattern_node_labels_ADDED, from_pattern_id_to_adj_id_map,
						adj_list_nodes, sets_of_used_edges, nodes_occupied_by_antecedent, edges_occupied_by_antecedent, debug);
					// process sets_of_used_edges (keep only maximal subsets)
					std::vector<non_dummy_vertices_and_edges> vector_of_edge_sets;
					for (set< non_dummy_vertices_and_edges >::iterator new_it = sets_of_used_edges.begin(); new_it != sets_of_used_edges.end(); new_it++)
					{
						vector_of_edge_sets.push_back(*new_it);
					}
					// here we get the IDs of non-dummy pattern edges and nodes; only maximal subsets (all other IDs are dummy)

					std::vector<non_dummy_vertices_and_edges> maximal_patterns_of_addition_edges = find_maximal_subsets_of_ndve(vector_of_edge_sets);

					// now for each such maximal set of addition patterns, create one anomaly pattern:
					for (size_t i = 0; i < maximal_patterns_of_addition_edges.size(); i++)
					{
						std::vector<std::array<int, PAT___SIZE>> anomaly_pattern_edges_all;
						for (size_t i = 0; i < anomaly_pattern_edges.size(); i++)
						{
							anomaly_pattern_edges_all.push_back(anomaly_pattern_edges[i]);
						}

						// add addition edges to anomaly_pattern_edges_all:
						// we need to mark dummy vertices and edges:

						int num_of_dummy_elements = 0;

                        // checking these addition edges:
						for (size_t j = 0; j < antecedent_pattern_edges_ADDED.size(); j++)
						{
							std::array<int, PAT___SIZE> anomaly_edge;
							// first just copy the edge as it is:
							for (size_t k = 0; k < PAT___SIZE; k++)
							{
								anomaly_edge[k] = antecedent_pattern_edges_ADDED[j][k];
							}
							
							// then, if there are some dummy elements, modify them:
							// if they were "addition nodes" then we must check it by using the results from find_addition_nodes_and_edges()
							bool is_src_vertex_nondummy = maximal_patterns_of_addition_edges[i].non_dummy_vertices.find(antecedent_pattern_edges_ADDED[j][PAT_SRC_ID]) != maximal_patterns_of_addition_edges[i].non_dummy_vertices.end();
							bool is_dst_vertex_nondummy = maximal_patterns_of_addition_edges[i].non_dummy_vertices.find(antecedent_pattern_edges_ADDED[j][PAT_DST_ID]) != maximal_patterns_of_addition_edges[i].non_dummy_vertices.end();
							bool is_edge_nondummy = maximal_patterns_of_addition_edges[i].non_dummy_edges.find(antecedent_pattern_edges_ADDED[j][PAT_ID]) != maximal_patterns_of_addition_edges[i].non_dummy_edges.end();

							// if they are not "addition" nodes, then it is clear that these nodes are not dummy:
							is_src_vertex_nondummy = is_src_vertex_nondummy || (antecedent_pattern_edges_ADDED[j][PAT_SRC_CHANGETIME] != 0);
							is_dst_vertex_nondummy = is_dst_vertex_nondummy || (antecedent_pattern_edges_ADDED[j][PAT_DST_CHANGETIME] != 0);

							if (!is_src_vertex_nondummy) anomaly_edge[PAT_SRC_LABEL] = pu.getDummyLabel(anomaly_edge[PAT_SRC_LABEL]);
							if (!is_dst_vertex_nondummy) anomaly_edge[PAT_DST_LABEL] = pu.getDummyLabel(anomaly_edge[PAT_DST_LABEL]);
							if (!is_edge_nondummy) anomaly_edge[PAT_LABEL] = pu.getDummyLabel(anomaly_edge[PAT_LABEL]);

							num_of_dummy_elements += (!is_src_vertex_nondummy + !is_dst_vertex_nondummy + !is_edge_nondummy);

							anomaly_pattern_edges_all.push_back(anomaly_edge);
						}

						// if there are no regular edges from the antecedent and all "ADDITION" edges contain only DUMMY elements, then the pattern is pure "ADDITION-DUMMY"
						bool is_only_addition_pattern = (anomaly_pattern_edges.size() == 0) && (antecedent_pattern_edges_ADDED.size() * 3 == num_of_dummy_elements);

						// we cannot save patterns which are pure "ADDITION-DUMMY" if the current snapshot contain the frequent pattern
						// (more precisely, we don't save the occurrence)
						if (!is_only_addition_pattern || nodes_occupied_by_antecedent.size() == 0)
						{
							// and now save the anomalous pattern with its occurrences 
							anomaly_pattern_with_occurrences ap;
							ap.anomalous_pattern_edges = anomaly_pattern_edges_all;
							ap.minimum_code = compute_min_code(anomaly_pattern_edges_all);
							auto it = anomaly_patterns.find(ap);
							if (it != std::end(anomaly_patterns))
							{

								(it->occurrences).insert(g_id);
							}
							else
							{
								ap.occurrences.insert(g_id);
								anomaly_patterns.insert(ap);
							}
						}


					}
				}
                // ALL FOUND ISOLATED VERTICES PROCESSED

				// if there were no isolated vertices, just end after all anomaly patterns were saved
				if (antecedent_pattern_isolated_node_id.size() == 0)
				{
					return;
				}

				// NOW WE may try different solution
			}

			// try to map next isolated node:
			bool should_backtrack = true;
			for (int node_candidate_index = which_indices_were_used[isolated_vertex_current_index]; node_candidate_index < adj_list_nodes.size(); node_candidate_index++)
			{
				// if the current adjacency node wasn't used yet, AND it ins't occupied by the mapped antecedent edges, AND it is not occupied by the FREQUENT PATTERN antecedent:
				bool is_occupied_in_adj_nodes = occupied_node_ids_in_adj_list.find(node_candidate_index) != occupied_node_ids_in_adj_list.end();
				bool is_occupied_by_frequent_pattern = nodes_occupied_by_antecedent.find(node_candidate_index) != nodes_occupied_by_antecedent.end();
				if (!adjacency_nodes_are_used[node_candidate_index] && !is_occupied_in_adj_nodes && !is_occupied_by_frequent_pattern)
				{
					// if it is same as that isolated vertex:
					// (we must take the antecedent info of both nodes)
					bool are_same = pu.getAntecedentLabel(adj_list_nodes[node_candidate_index][ADJ_NODES_LABEL]) == pu.getAntecedentLabel(antecedent_pattern_isolated_node_labels[isolated_vertex_current_index]) &&
						pu.getAntecedentChangetime(adj_list_nodes[node_candidate_index][ADJ_NODES_CHANGETIME]) == pu.getAntecedentChangetime(antecedent_pattern_isolated_node_changetime[isolated_vertex_current_index]);

					if (are_same)
					{
						should_backtrack = false;

						which_indices_were_used[isolated_vertex_current_index] = node_candidate_index + 1;
						which_indices_were_used.push_back(0);
						selected_ids_from_adj.push_back(adj_list_nodes[node_candidate_index][ADJ_NODES_ID]);
						adjacency_nodes_are_used[node_candidate_index] = true;
						isolated_vertex_current_index++;
						break;
					}
				}
			}

			// if we could not map this isolated vertex, backtrack:
			if (isolated_vertex_current_index != 0 && should_backtrack)
			{
				which_indices_were_used.pop_back();

				adjacency_nodes_are_used[which_indices_were_used.back() - 1] = false;

				selected_ids_from_adj.pop_back();

				isolated_vertex_current_index--;
			}
			if (isolated_vertex_current_index == 0 && should_backtrack)
			{
				// we tried all combinations, just end:
				break;
			}
		}
	}